

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIsoFast.c
# Opt level: O3

Vec_Int_t * Iso_StoCollectInfo(Iso_Sto_t *p,Aig_Obj_t *pPo)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Aig_Man_t *p_00;
  Iso_Dat_t *pIVar5;
  void **__ptr;
  Vec_Int_t *pVVar6;
  int *piVar7;
  Vec_Int_t *pVVar8;
  int *piVar9;
  int iVar10;
  Aig_Obj_t *pObj;
  ulong uVar11;
  Vec_Ptr_t *pVVar12;
  long lVar13;
  
  if ((*(uint *)&pPo->field_0x18 & 7) != 3) {
    __assert_fail("Aig_ObjIsCo(pPo)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoFast.c"
                  ,0xba,"Vec_Int_t *Iso_StoCollectInfo(Iso_Sto_t *, Aig_Obj_t *)");
  }
  p_00 = p->pAig;
  pIVar5 = p->pData;
  iVar10 = 0;
  p->vVisited->nSize = 0;
  pVVar12 = p->vRoots;
  pVVar12->nSize = 0;
  __ptr = pVVar12->pArray;
  if (pVVar12->nCap == 0) {
    if (__ptr == (void **)0x0) {
      __ptr = (void **)malloc(0x80);
      iVar10 = 0;
    }
    else {
      __ptr = (void **)realloc(__ptr,0x80);
      iVar10 = pVVar12->nSize;
    }
    pVVar12->pArray = __ptr;
    pVVar12->nCap = 0x10;
  }
  pVVar12->nSize = iVar10 + 1;
  __ptr[iVar10] = pPo;
  pVVar12 = p->vRoots;
  if (0 < pVVar12->nSize) {
    lVar13 = 0;
    do {
      uVar11 = *(ulong *)((long)pVVar12->pArray[lVar13] + 8);
      pObj = (Aig_Obj_t *)(uVar11 & 0xfffffffffffffffe);
      if ((*(uint *)&pObj->field_0x18 & 7) != 1) {
        Iso_StoCollectInfo_rec(p_00,pObj,(uint)uVar11 & 1,p->vVisited,p->pData,pVVar12);
        pVVar12 = p->vRoots;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < pVVar12->nSize);
  }
  pVVar8 = p->vPlaces;
  pVVar8->nSize = 0;
  pVVar6 = p->vVisited;
  if (0 < pVVar6->nSize) {
    lVar13 = 0;
    do {
      iVar10 = pVVar6->pArray[lVar13];
      uVar1 = *(ushort *)(pIVar5 + iVar10);
      iVar2 = p->pCounters[uVar1];
      p->pCounters[uVar1] = iVar2 + 1;
      if (iVar2 == 0) {
        Vec_IntPush(p->vPlaces,(uint)uVar1);
        pVVar6 = p->vVisited;
      }
      p->pData[iVar10] = (Iso_Dat_t)0x0;
      lVar13 = lVar13 + 1;
    } while (lVar13 < pVVar6->nSize);
    pVVar8 = p->vPlaces;
  }
  pVVar6->nSize = 0;
  if (pVVar8->nSize < 1) {
    iVar10 = 0;
  }
  else {
    piVar7 = p->pCounters;
    lVar13 = 0;
    do {
      iVar10 = pVVar8->pArray[lVar13];
      if (piVar7[iVar10] == 0) {
        __assert_fail("p->pCounters[Entry]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoFast.c"
                      ,0xd7,"Vec_Int_t *Iso_StoCollectInfo(Iso_Sto_t *, Aig_Obj_t *)");
      }
      Vec_IntPush(p->vVisited,piVar7[iVar10]);
      piVar7 = p->pCounters;
      piVar7[iVar10] = 0;
      lVar13 = lVar13 + 1;
      pVVar8 = p->vPlaces;
    } while (lVar13 < pVVar8->nSize);
    pVVar6 = p->vVisited;
    iVar10 = pVVar6->nSize;
  }
  piVar7 = Abc_MergeSortCost(pVVar6->pArray,iVar10);
  iVar10 = *piVar7;
  if (-1 < (long)iVar10) {
    uVar3 = p->vVisited->nSize;
    if (iVar10 < (int)uVar3) {
      uVar4 = piVar7[(ulong)uVar3 - 1];
      if ((-1 < (long)(int)uVar4) && (uVar4 < uVar3)) {
        piVar9 = p->vVisited->pArray;
        if (piVar9[(int)uVar4] < piVar9[iVar10]) {
          __assert_fail("Vec_IntEntry(p->vVisited, pPerm[0]) <= Vec_IntEntry(p->vVisited, pPerm[Vec_IntSize(p->vVisited)-1])"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoFast.c"
                        ,0xdf,"Vec_Int_t *Iso_StoCollectInfo(Iso_Sto_t *, Aig_Obj_t *)");
        }
        pVVar8 = (Vec_Int_t *)malloc(0x10);
        uVar11 = 0x10;
        if (0x10 < uVar3) {
          uVar11 = (ulong)uVar3;
        }
        pVVar8->nSize = 0;
        pVVar8->nCap = (int)uVar11;
        piVar9 = (int *)malloc(uVar11 << 2);
        pVVar8->pArray = piVar9;
        uVar11 = (ulong)uVar3 + 1;
        while( true ) {
          iVar10 = piVar7[uVar11 - 2];
          lVar13 = (long)iVar10;
          if (((lVar13 < 0) || (p->vVisited->nSize <= iVar10)) || (p->vPlaces->nSize <= iVar10))
          break;
          Vec_IntPush(pVVar8,p->vVisited->pArray[lVar13] << 0x10 | p->vPlaces->pArray[lVar13]);
          uVar11 = uVar11 - 1;
          if (uVar11 < 2) {
            free(piVar7);
            return pVVar8;
          }
        }
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

Vec_Int_t * Iso_StoCollectInfo( Iso_Sto_t * p, Aig_Obj_t * pPo )
{
    int fVerboseShow = 0;
    Vec_Int_t * vInfo;
    Iso_Dat2_t * pData2 = (Iso_Dat2_t *)p->pData;
    Aig_Man_t * pAig = p->pAig;
    Aig_Obj_t * pObj;
    int i, Value, Entry, * pPerm;
//    abctime clk = Abc_Clock();

    assert( Aig_ObjIsCo(pPo) );

    // collect initial POs
    Vec_IntClear( p->vVisited );
    Vec_PtrClear( p->vRoots );
    Vec_PtrPush( p->vRoots, pPo );

    // mark internal nodes
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vRoots, pObj, i )
        if ( !Aig_ObjIsConst1(Aig_ObjFanin0(pObj)) )
            Iso_StoCollectInfo_rec( pAig, Aig_ObjFanin0(pObj), Aig_ObjFaninC0(pObj), p->vVisited, p->pData, p->vRoots );
//    time_Trav += Abc_Clock() - clk;

    // count how many times each data entry appears
    Vec_IntClear( p->vPlaces );
    Vec_IntForEachEntry( p->vVisited, Entry, i )
    {
        Value = pData2[Entry].Data;
//        assert( Value > 0 );
        if ( p->pCounters[Value]++ == 0 )
            Vec_IntPush( p->vPlaces, Value );
//        pData2[Entry].Data = 0;
        *((int *)(p->pData + Entry)) = 0;
    }

    // collect non-trivial counters
    Vec_IntClear( p->vVisited );
    Vec_IntForEachEntry( p->vPlaces, Entry, i )
    {
        assert( p->pCounters[Entry] );
        Vec_IntPush( p->vVisited, p->pCounters[Entry] );
        p->pCounters[Entry] = 0;
    }
//    printf( "%d ", Vec_IntSize(p->vVisited) );

    // sort the costs in the increasing order
    pPerm = Abc_MergeSortCost( Vec_IntArray(p->vVisited), Vec_IntSize(p->vVisited) );
    assert( Vec_IntEntry(p->vVisited, pPerm[0]) <= Vec_IntEntry(p->vVisited, pPerm[Vec_IntSize(p->vVisited)-1]) );

    // create information
    vInfo = Vec_IntAlloc( Vec_IntSize(p->vVisited) );
    for ( i = Vec_IntSize(p->vVisited)-1; i >= 0; i-- )
    {
        Entry = Vec_IntEntry( p->vVisited, pPerm[i] );
        Entry = (Entry << AIG_ISO_NUM) | Vec_IntEntry( p->vPlaces, pPerm[i] );
        Vec_IntPush( vInfo, Entry );
    }
    ABC_FREE( pPerm );

    // show the final result
    if ( fVerboseShow )
    Vec_IntForEachEntry( vInfo, Entry, i )
    {
        Iso_Dat2_t Data = { Entry & 0xFFFF };
        Iso_Dat_t * pData = (Iso_Dat_t *)&Data;

        printf( "%6d : ", i );
        printf( "Freq =%6d ", Entry >> 16 );

        printf( "FiNeg =%3d ", pData->nFiNeg );
        printf( "FoNeg =%3d ", pData->nFoNeg );
        printf( "FoPos =%3d ", pData->nFoPos );
        printf( "Fi0L  =%3d ", pData->Fi0Lev );
        printf( "Fi1L  =%3d ", pData->Fi1Lev );
        printf( "Lev   =%3d ", pData->Level  );
        printf( "\n" );
    }
    return vInfo;
}